

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_TagBox.cpp
# Opt level: O1

void __thiscall
amrex::TagBox::get_itags(TagBox *this,Vector<int,_std::allocator<int>_> *ar,Box *tilebx)

{
  char *pcVar1;
  long lVar2;
  pointer piVar3;
  size_type __new_size;
  int iVar4;
  long lVar5;
  char *pcVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  int Ltb [3];
  Long stride [3];
  int local_58 [4];
  long local_48 [4];
  
  local_48[0] = 1;
  lVar10 = (long)(((this->super_BaseFab<char>).domain.bigend.vect[0] -
                  (this->super_BaseFab<char>).domain.smallend.vect[0]) + 1);
  local_48[1] = lVar10;
  lVar8 = (((this->super_BaseFab<char>).domain.bigend.vect[1] -
           (this->super_BaseFab<char>).domain.smallend.vect[1]) + 1) * lVar10;
  local_48[2] = lVar8;
  local_58[0] = 1;
  local_58[1] = 1;
  local_58[2] = 1;
  __new_size = 1;
  lVar2 = 0;
  lVar9 = 0;
  do {
    iVar7 = *(int *)((long)(tilebx->smallend).vect + lVar2);
    iVar4 = (*(int *)((long)(tilebx->bigend).vect + lVar2) - iVar7) + 1;
    *(int *)((long)local_58 + lVar2) = iVar4;
    __new_size = __new_size * (long)iVar4;
    lVar9 = lVar9 + ((long)iVar7 -
                    (long)*(int *)((long)(this->super_BaseFab<char>).domain.smallend.vect + lVar2))
                    * *(long *)((long)local_48 + lVar2 * 2);
    lVar2 = lVar2 + 4;
  } while (lVar2 != 0xc);
  if ((long)(ar->super_vector<int,_std::allocator<int>_>).
            super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
      - (long)(ar->super_vector<int,_std::allocator<int>_>).
              super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
      >> 2 < (long)__new_size) {
    std::vector<int,_std::allocator<int>_>::resize
              (&ar->super_vector<int,_std::allocator<int>_>,__new_size);
  }
  pcVar1 = BaseFab<char>::dataPtr(&this->super_BaseFab<char>,0);
  if (0 < local_58[2]) {
    piVar3 = (ar->super_vector<int,_std::allocator<int>_>).
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
    lVar2 = 0;
    do {
      if (0 < local_58[1]) {
        lVar5 = 0;
        do {
          if (0 < local_58[0]) {
            pcVar6 = pcVar1 + lVar5 * lVar10 + lVar8 * lVar2 + lVar9;
            iVar7 = 0;
            do {
              *piVar3 = (int)*pcVar6;
              iVar7 = iVar7 + 1;
              pcVar6 = pcVar6 + 1;
              piVar3 = piVar3 + 1;
            } while (iVar7 < local_58[0]);
          }
          lVar5 = lVar5 + 1;
        } while (lVar5 < local_58[1]);
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 < local_58[2]);
  }
  return;
}

Assistant:

void
TagBox::get_itags(Vector<int>& ar, const Box& tilebx) const noexcept
{
    auto dlen = length();
    int Lbx[] = {1,1,1};
    for (int idim=0; idim<AMREX_SPACEDIM; idim++) {
        Lbx[idim] = dlen[idim];
    }

    Long stride[] = {1, Lbx[0], Long(Lbx[0])*Long(Lbx[1])};

    Long Ntb = 1, stb=0;
    int Ltb[] = {1,1,1};
    for (int idim=0; idim<AMREX_SPACEDIM; idim++) {
        Ltb[idim] = tilebx.length(idim);
        Ntb *= Ltb[idim];
        stb += stride[idim] * (tilebx.smallEnd(idim) - domain.smallEnd(idim));
    }

    if (ar.size() < Ntb) ar.resize(Ntb);

    const TagType* const p0   = dataPtr() + stb;  // +stb to the lower corner of tilebox
    int*                 iptr = ar.dataPtr();

    for (int k=0; k<Ltb[2]; k++) {
        for (int j=0; j<Ltb[1]; j++) {
            const TagType* cptr = p0 + j*stride[1] + k*stride[2];
            for (int i=0; i<Ltb[0]; i++, cptr++, iptr++) {
                if (*cptr) {
                    *iptr = *cptr;
                }
                else {
                    *iptr = TagBox::CLEAR;
                }
            }
        }
    }
}